

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixSegment.hpp
# Opt level: O0

void __thiscall
cppjieba::MixSegment::Cut
          (MixSegment *this,const_iterator begin,const_iterator end,
          vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *res,bool hmm)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  size_type sVar4;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *res_00;
  value_type *pvVar5;
  MPSegment *in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  byte in_R8B;
  size_t k;
  size_t j;
  size_t i;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> hmmRes;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> words;
  Rune *in_stack_fffffffffffffee8;
  MPSegment *in_stack_fffffffffffffef0;
  value_type *in_stack_fffffffffffffef8;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *in_stack_ffffffffffffff00;
  const_iterator pRVar6;
  const_iterator in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *in_stack_ffffffffffffff28;
  const_iterator in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  byte bVar7;
  MPSegment *in_stack_ffffffffffffff40;
  value_type *local_80;
  size_type local_78;
  ulong local_70;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> local_68;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> local_40;
  byte local_21;
  MPSegment *local_20;
  ulong local_18;
  ulong local_10;
  
  local_21 = in_R8B & 1;
  if (local_21 == 0) {
    MPSegment::Cut(in_stack_ffffffffffffff40,
                   (const_iterator)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
                   in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                   CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  }
  else {
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::vector
              ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)0x11ef2e);
    if (local_18 < local_10) {
      __assert_fail("end >= begin",
                    "/workspace/llm4binary/github/license_c_cmakelists/yanyiwu[P]simhash/submodules/cppjieba/include/cppjieba/MixSegment.hpp"
                    ,0x34,
                    "void cppjieba::MixSegment::Cut(RuneStrArray::const_iterator, RuneStrArray::const_iterator, vector<WordRange> &, bool) const"
                   );
    }
    std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::reserve
              ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
               CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (size_type)in_stack_ffffffffffffff18);
    MPSegment::Cut(in_stack_ffffffffffffff40,
                   (const_iterator)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
                   in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                   CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
    std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::vector
              ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)0x11efdb);
    std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::reserve
              ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
               CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (size_type)in_stack_ffffffffffffff18);
    for (local_70 = 0;
        sVar2 = std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::size
                          (&local_40), local_70 < sVar2; local_70 = local_70 + 1) {
      pvVar3 = std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::operator[]
                         (&local_40,local_70);
      pRVar6 = pvVar3->left;
      pvVar3 = std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::operator[]
                         (&local_40,local_70);
      if (pRVar6 == pvVar3->right) {
        pvVar3 = std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::operator[]
                           (&local_40,local_70);
        pRVar6 = pvVar3->left;
        pvVar3 = std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::operator[]
                           (&local_40,local_70);
        if (pRVar6 == pvVar3->right) {
          std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::operator[]
                    (&local_40,local_70);
          bVar1 = MPSegment::IsUserDictSingleChineseWord
                            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
          if (bVar1) goto LAB_0011f117;
        }
        local_78 = local_70;
        while( true ) {
          sVar2 = local_78;
          sVar4 = std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::size
                            (&local_40);
          bVar7 = 0;
          if (sVar2 < sVar4) {
            pvVar3 = std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::
                     operator[](&local_40,local_78);
            pRVar6 = pvVar3->left;
            pvVar3 = std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::
                     operator[](&local_40,local_78);
            bVar7 = 0;
            if (pRVar6 == pvVar3->right) {
              in_stack_ffffffffffffff18 = (const_iterator)(in_RDI + 0x40);
              std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::operator[]
                        (&local_40,local_78);
              in_stack_ffffffffffffff27 =
                   MPSegment::IsUserDictSingleChineseWord
                             (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
              bVar7 = in_stack_ffffffffffffff27 ^ 0xff;
            }
          }
          if ((bVar7 & 1) == 0) break;
          local_78 = local_78 + 1;
        }
        if (local_78 - 1 < local_70) {
          __assert_fail("j - 1 >= i",
                        "/workspace/llm4binary/github/license_c_cmakelists/yanyiwu[P]simhash/submodules/cppjieba/include/cppjieba/MixSegment.hpp"
                        ,0x48,
                        "void cppjieba::MixSegment::Cut(RuneStrArray::const_iterator, RuneStrArray::const_iterator, vector<WordRange> &, bool) const"
                       );
        }
        res_00 = (vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
                 (in_RDI + 0x90);
        in_stack_ffffffffffffff00 = &local_40;
        pvVar3 = std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::operator[]
                           (in_stack_ffffffffffffff00,local_70);
        pRVar6 = pvVar3->left;
        std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::operator[]
                  (in_stack_ffffffffffffff00,local_78 - 1);
        HMMSegment::Cut((HMMSegment *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                        in_stack_ffffffffffffff18,pRVar6,res_00);
        local_80 = (value_type *)0x0;
        while (in_stack_fffffffffffffef8 = local_80,
              pvVar5 = (value_type *)
                       std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::size
                                 (&local_68), in_stack_fffffffffffffef8 < pvVar5) {
          in_stack_fffffffffffffef0 = local_20;
          std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::operator[]
                    (&local_68,(size_type)local_80);
          std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back
                    (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
          local_80 = (value_type *)((long)&local_80->left + 1);
        }
        std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::clear
                  ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)0x11f3a3);
        local_70 = local_78 - 1;
      }
      else {
LAB_0011f117:
        std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::operator[]
                  (&local_40,local_70);
        std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back
                  (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      }
    }
    std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::~vector
              (in_stack_ffffffffffffff00);
    std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::~vector
              (in_stack_ffffffffffffff00);
  }
  return;
}

Assistant:

void Cut(RuneStrArray::const_iterator begin, RuneStrArray::const_iterator end, vector<WordRange>& res, bool hmm) const {
    if (!hmm) {
      mpSeg_.Cut(begin, end, res);
      return;
    }
    vector<WordRange> words;
    assert(end >= begin);
    words.reserve(end - begin);
    mpSeg_.Cut(begin, end, words);

    vector<WordRange> hmmRes;
    hmmRes.reserve(end - begin);
    for (size_t i = 0; i < words.size(); i++) {
      //if mp Get a word, it's ok, put it into result
      if (words[i].left != words[i].right || (words[i].left == words[i].right && mpSeg_.IsUserDictSingleChineseWord(words[i].left->rune))) {
        res.push_back(words[i]);
        continue;
      }

      // if mp Get a single one and it is not in userdict, collect it in sequence
      size_t j = i;
      while (j < words.size() && words[j].left == words[j].right && !mpSeg_.IsUserDictSingleChineseWord(words[j].left->rune)) {
        j++;
      }

      // Cut the sequence with hmm
      assert(j - 1 >= i);
      // TODO
      hmmSeg_.Cut(words[i].left, words[j - 1].left + 1, hmmRes);
      //put hmm result to result
      for (size_t k = 0; k < hmmRes.size(); k++) {
        res.push_back(hmmRes[k]);
      }

      //clear tmp vars
      hmmRes.clear();

      //let i jump over this piece
      i = j - 1;
    }
  }